

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O2

char * google::protobuf::internal::WireFormat::_InternalParse
                 (Message *msg,char *ptr,ParseContext *ctx)

{
  DescriptorPool *this;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  char *pcVar4;
  FieldDescriptor *field;
  Reflection *this_01;
  uint key;
  LogFinisher local_71;
  char *ptr_local;
  MessageSetParser message_set;
  Descriptor *this_00;
  
  ptr_local = ptr;
  iVar2 = (*(msg->super_MessageLite)._vptr_MessageLite[0x11])();
  this_00 = (Descriptor *)CONCAT44(extraout_var,iVar2);
  (*(msg->super_MessageLite)._vptr_MessageLite[0x11])(msg);
  if (this_00 == (Descriptor *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)&message_set,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x30e);
    pLVar3 = LogMessage::operator<<((LogMessage *)&message_set,"CHECK failed: descriptor: ");
    LogFinisher::operator=(&local_71,pLVar3);
    LogMessage::~LogMessage((LogMessage *)&message_set);
  }
  if (this_01 == (Reflection *)0x0) {
    LogMessage::LogMessage
              ((LogMessage *)&message_set,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/wire_format.cc"
               ,0x30f);
    pLVar3 = LogMessage::operator<<((LogMessage *)&message_set,"CHECK failed: reflection: ");
    LogFinisher::operator=(&local_71,pLVar3);
    LogMessage::~LogMessage((LogMessage *)&message_set);
  }
  if (*(char *)(*(long *)(this_00 + 0x20) + 0x48) == '\0') {
    do {
      bVar1 = ParseContext::Done(ctx,&ptr_local);
      if (bVar1) {
        return ptr_local;
      }
      ptr_local = ReadTag(ptr_local,(uint32_t *)&message_set,0);
      if (ptr_local == (char *)0x0) break;
      if (((uint)message_set.msg == 0) || (((uint)message_set.msg & 7) == 4)) {
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = (uint)message_set.msg - 1;
        return ptr_local;
      }
      key = (uint)message_set.msg >> 3;
      field = Descriptor::FindFieldByNumber(this_00,key);
      if (field == (FieldDescriptor *)0x0) {
        bVar1 = Descriptor::IsExtensionNumber(this_00,key);
        if (bVar1) {
          this = (ctx->data_).pool;
          if (this == (DescriptorPool *)0x0) {
            field = Reflection::FindKnownExtensionByNumber(this_01,key);
          }
          else {
            field = DescriptorPool::FindExtensionByNumber(this,this_00,key);
          }
        }
        else {
          field = (FieldDescriptor *)0x0;
        }
      }
      ptr_local = _InternalParseAndMergeField
                            (msg,ptr_local,ctx,(ulong)message_set.msg & 0xffffffff,this_01,field);
    } while (ptr_local != (char *)0x0);
    pcVar4 = (char *)0x0;
  }
  else {
    message_set.msg = msg;
    message_set.descriptor = this_00;
    pcVar4 = MessageSetParser::ParseMessageSet(&message_set,ptr,ctx);
  }
  return pcVar4;
}

Assistant:

const char* WireFormat::_InternalParse(Message* msg, const char* ptr,
                                       internal::ParseContext* ctx) {
  const Descriptor* descriptor = msg->GetDescriptor();
  const Reflection* reflection = msg->GetReflection();
  GOOGLE_DCHECK(descriptor);
  GOOGLE_DCHECK(reflection);
  if (descriptor->options().message_set_wire_format()) {
    MessageSetParser message_set{msg, descriptor, reflection};
    return message_set.ParseMessageSet(ptr, ctx);
  }
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ReadTag(ptr, &tag);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
    if (tag == 0 || (tag & 7) == WireFormatLite::WIRETYPE_END_GROUP) {
      ctx->SetLastTag(tag);
      break;
    }
    const FieldDescriptor* field = nullptr;

    int field_number = WireFormatLite::GetTagFieldNumber(tag);
    field = descriptor->FindFieldByNumber(field_number);

    // If that failed, check if the field is an extension.
    if (field == nullptr && descriptor->IsExtensionNumber(field_number)) {
      if (ctx->data().pool == nullptr) {
        field = reflection->FindKnownExtensionByNumber(field_number);
      } else {
        field =
            ctx->data().pool->FindExtensionByNumber(descriptor, field_number);
      }
    }

    ptr = _InternalParseAndMergeField(msg, ptr, ctx, tag, reflection, field);
    if (PROTOBUF_PREDICT_FALSE(ptr == nullptr)) return nullptr;
  }
  return ptr;
}